

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

void __thiscall
icu_63::Normalizer2Impl::decompose
          (Normalizer2Impl *this,UChar *src,UChar *limit,UnicodeString *dest,
          int32_t destLengthEstimate,UErrorCode *errorCode)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  EVP_PKEY_CTX *ctx;
  ReorderingBuffer buffer;
  ReorderingBuffer local_60;
  
  uVar4 = (ulong)((long)limit - (long)src) >> 1;
  if (-1 < destLengthEstimate) {
    uVar4 = (ulong)(uint)destLengthEstimate;
  }
  ctx = (EVP_PKEY_CTX *)(uVar4 & 0xffffffff);
  if (limit == (UChar *)0x0) {
    ctx = (EVP_PKEY_CTX *)(ulong)(uint)destLengthEstimate;
  }
  uVar1 = (dest->fUnion).fStackFields.fLengthAndFlags;
  uVar2 = 2;
  if ((uVar1 & 1) == 0) {
    uVar2 = uVar1 & 0x1e;
  }
  (dest->fUnion).fStackFields.fLengthAndFlags = uVar2;
  local_60.start = (UChar *)0x0;
  local_60.reorderStart._0_5_ = 0;
  local_60.reorderStart._5_3_ = 0;
  local_60.limit._0_5_ = 0;
  local_60._37_8_ = 0;
  local_60.impl = this;
  local_60.str = dest;
  iVar3 = ReorderingBuffer::init(&local_60,ctx);
  if ((char)iVar3 != '\0') {
    decompose(this,src,limit,&local_60,errorCode);
  }
  ReorderingBuffer::~ReorderingBuffer(&local_60);
  return;
}

Assistant:

void
Normalizer2Impl::decompose(const UChar *src, const UChar *limit,
                           UnicodeString &dest,
                           int32_t destLengthEstimate,
                           UErrorCode &errorCode) const {
    if(destLengthEstimate<0 && limit!=NULL) {
        destLengthEstimate=(int32_t)(limit-src);
    }
    dest.remove();
    ReorderingBuffer buffer(*this, dest);
    if(buffer.init(destLengthEstimate, errorCode)) {
        decompose(src, limit, &buffer, errorCode);
    }
}